

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  FILE *__stream;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  __int32_t **pp_Var10;
  long lVar11;
  byte bVar12;
  _Bool load;
  int i;
  long lVar13;
  uchar uVar14;
  ulong uVar15;
  char *pcVar16;
  bool bVar17;
  char *local_1190;
  char command_line [200];
  em8051 local_10b8;
  
  if (argc < 2) {
    __assert_fail("argc > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JayFoxRox[P]mtk-odd-emulator/main.c"
                  ,0x106,"int main(int, char **)");
  }
  __stream = fopen(argv[1],"rb");
  sVar7 = fread(flash,1,0x20000,__stream);
  if (sVar7 != 0x20000) {
    __assert_fail("ret == sizeof(flash)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JayFoxRox[P]mtk-odd-emulator/main.c"
                  ,0x109,"int main(int, char **)");
  }
  fclose(__stream);
  memset(&local_10b8.mCodeMemSize,0,0x1080);
  local_10b8.mCodeMem = (uchar *)malloc(0x10000);
  local_10b8.mCodeMemSize = 0x10000;
  local_10b8.mExtData = (uchar *)malloc(0x10000);
  local_10b8.mExtDataSize = 0x10000;
  local_10b8.mLowerData = (uchar *)malloc(0x100);
  local_10b8.mUpperData = local_10b8.mLowerData + 0x80;
  local_10b8.mSFR = (uchar *)malloc(0x80);
  local_10b8.except = emu_exception;
  local_10b8.sfrread = emu_sfrread;
  local_10b8.sfrwrite = sfrwrite;
  local_10b8.xread = xread;
  local_10b8.xwrite = xwrite;
  reset(&local_10b8,1);
  memcpy(local_10b8.mCodeMem,flash + ((local_10b8.mSFR[0x10] & 1) << 0x10),0x10000);
  for (uVar15 = 2; (uint)argc != uVar15; uVar15 = uVar15 + 1) {
    add_command(argv[uVar15]);
  }
  signal(2,sigint_handler);
  local_1190 = strdup("");
  do {
    if ((command_count == 0 & requested_pause) == 1) {
      printf("> ");
      fgets(command_line,200,_stdin);
      pcVar8 = strchr(command_line,10);
      if (pcVar8 == command_line) {
        strcpy(command_line,local_1190);
      }
      else {
        *pcVar8 = '\0';
        free(local_1190);
        local_1190 = strdup(command_line);
      }
      add_command(command_line);
    }
    do {
      if (command_count == 0) goto LAB_001035f8;
      pcVar8 = *commands;
      bVar17 = false;
      printf("Command \'%s\'\n",pcVar8);
      pcVar8 = strtok(pcVar8," ");
      if (pcVar8 != (char *)0x0) {
        iVar3 = strcmp(pcVar8,"help");
        if (iVar3 == 0) {
          puts("The help command is not supported yet.");
        }
        else {
          iVar3 = strcmp(pcVar8,"pause");
          if ((iVar3 != 0) && ((cVar1 = *pcVar8, cVar1 != 'p' || (pcVar8[1] != '\0')))) {
            iVar3 = strcmp(pcVar8,"continue");
            if ((iVar3 == 0) || ((cVar1 == 'c' && (pcVar8[1] == '\0')))) {
              steps = 0xffffffff;
              bVar17 = true;
            }
            else {
              iVar3 = strcmp(pcVar8,"step");
              if ((iVar3 == 0) || ((cVar1 == 's' && (pcVar8[1] == '\0')))) {
                pcVar8 = strtok((char *)0x0," ");
                uVar6 = 1;
                if (pcVar8 != (char *)0x0) {
                  uVar6 = parse_dec(pcVar8);
                }
                bVar17 = uVar6 != 0;
                steps = uVar6;
              }
              else {
                iVar3 = strcmp(pcVar8,"quit");
                if ((iVar3 == 0) || ((cVar1 == 'q' && (pcVar8[1] == '\0')))) {
                  exit(0);
                }
                iVar3 = strcmp(pcVar8,"save");
                if (iVar3 == 0) {
                  pcVar8 = strtok((char *)0x0," ");
                  printf("Saving to \'%s\'\n",pcVar8);
                  load = false;
                }
                else {
                  iVar3 = strcmp(pcVar8,"load");
                  if (iVar3 != 0) {
                    iVar3 = strcmp(pcVar8,"trace");
                    if (iVar3 == 0) {
                      trace = 1;
                    }
                    else {
                      iVar3 = strcmp(pcVar8,"scsi");
                      if (iVar3 != 0) {
                        iVar3 = strcmp(pcVar8,"set");
                        if (iVar3 == 0) {
                          while( true ) {
                            bVar17 = false;
                            pcVar8 = strtok((char *)0x0," ");
                            if (pcVar8 == (char *)0x0) break;
                            pcVar9 = strchr(pcVar8,0x3d);
                            *pcVar9 = '\0';
                            for (pcVar16 = pcVar8; cVar1 = *pcVar16, (long)cVar1 != 0;
                                pcVar16 = pcVar16 + 1) {
                              pp_Var10 = __ctype_tolower_loc();
                              *pcVar16 = (char)(*pp_Var10)[cVar1];
                            }
                            pcVar9 = pcVar9 + 1;
                            printf("Setting \'%s\' to \'%s\'\n",pcVar8,pcVar9);
                            cVar1 = *pcVar8;
                            if (cVar1 == 'e') {
                              uVar6 = parse_hex(pcVar8 + 1);
                              uVar15 = (ulong)(int)uVar6;
                              for (; *pcVar9 != '\0'; pcVar9 = pcVar9 + 2) {
                                command_line._0_2_ = *(undefined2 *)pcVar9;
                                command_line[2] = '\0';
                                uVar6 = parse_hex(command_line);
                                printf("EXTMEM_%04X=%02X\n",uVar15 & 0xffffffff,(ulong)uVar6);
                                local_10b8.mExtData[uVar15] = (uchar)uVar6;
                                uVar15 = uVar15 + 1;
                              }
                            }
                            else if ((cVar1 == 'i') || (cVar1 == 's')) {
                              pcVar16 = strchr(pcVar8 + 1,0x2e);
                              if (pcVar16 != (char *)0x0) {
                                *pcVar16 = '\0';
                              }
                              uVar6 = parse_hex(pcVar8 + 1);
                              if (0xff < (int)uVar6) {
                                __assert_fail("index < 0x100",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/JayFoxRox[P]mtk-odd-emulator/commands.c"
                                              ,0xe4,"_Bool handle_command(struct em8051 *, char *)")
                                ;
                              }
                              uVar15 = (ulong)(int)uVar6;
                              if (pcVar16 == (char *)0x0) {
                                for (; *pcVar9 != '\0'; pcVar9 = pcVar9 + 2) {
                                  command_line._0_2_ = *(undefined2 *)pcVar9;
                                  command_line[2] = '\0';
                                  uVar6 = parse_hex(command_line);
                                  uVar14 = (uchar)uVar6;
                                  if (*pcVar8 == 's') {
                                    printf("SFR_%02X=%02X\n",uVar15 & 0xffffffff,(ulong)uVar6);
                                    if ((long)uVar15 < 0x80) {
                                      __assert_fail("index >= 0x80",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JayFoxRox[P]mtk-odd-emulator/commands.c"
                                                  ,0xf7,
                                                  "_Bool handle_command(struct em8051 *, char *)");
                                    }
                                    local_10b8.mSFR[uVar15 - 0x80] = uVar14;
                                    sfrwrite(&local_10b8,(int)uVar15);
                                  }
                                  else {
                                    if (*pcVar8 != 'i') {
                                      __assert_fail("false",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JayFoxRox[P]mtk-odd-emulator/commands.c"
                                                  ,0xfb,
                                                  "_Bool handle_command(struct em8051 *, char *)");
                                    }
                                    printf("INTMEM_%02X=%02X\n",uVar15 & 0xffffffff,(ulong)uVar6);
                                    if ((long)uVar15 < 0x80) {
                                      local_10b8.mLowerData[uVar15] = uVar14;
                                    }
                                    else {
                                      local_10b8.mUpperData[uVar15 - 0x80] = uVar14;
                                    }
                                  }
                                  uVar15 = uVar15 + 1;
                                }
                              }
                              else {
                                *pcVar16 = '\0';
                                uVar4 = parse_dec(pcVar16 + 1);
                                uVar5 = parse_hex(pcVar9);
                                if (*pcVar8 == 's') {
                                  printf("SFR_%02X.%d=%02X\n",(ulong)uVar6,(ulong)uVar4,
                                         (ulong)(uVar5 != 0));
                                  if ((int)uVar6 < 0x80) {
                                    __assert_fail("index >= 0x80",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JayFoxRox[P]mtk-odd-emulator/commands.c"
                                                  ,0x119,
                                                  "_Bool handle_command(struct em8051 *, char *)");
                                  }
                                  bVar12 = (byte)(1 << ((byte)uVar4 & 0x1f));
                                  bVar2 = ~bVar12 & local_10b8.mSFR[(ulong)uVar6 - 0x80];
                                  if (uVar5 != 0) {
                                    bVar2 = local_10b8.mSFR[(ulong)uVar6 - 0x80] | bVar12;
                                  }
                                  local_10b8.mSFR[(ulong)uVar6 - 0x80] = bVar2;
                                  sfrwrite(&local_10b8,uVar6);
                                }
                                else {
                                  if (*pcVar8 != 'i') {
                                    __assert_fail("false",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JayFoxRox[P]mtk-odd-emulator/commands.c"
                                                  ,0x121,
                                                  "_Bool handle_command(struct em8051 *, char *)");
                                  }
                                  printf("INTMEM_%02X.%d=%02X\n",(ulong)uVar6,(ulong)uVar4,
                                         (ulong)(uVar5 != 0));
                                  bVar2 = (byte)(1 << ((byte)uVar4 & 0x1f));
                                  if ((int)uVar6 < 0x80) {
                                    if (uVar5 == 0) {
                                      local_10b8.mLowerData[uVar15] =
                                           local_10b8.mLowerData[uVar15] & ~bVar2;
                                    }
                                    else {
                                      local_10b8.mLowerData[uVar15] =
                                           local_10b8.mLowerData[uVar15] | bVar2;
                                    }
                                  }
                                  else if (uVar5 == 0) {
                                    local_10b8.mUpperData[(ulong)uVar6 - 0x80] =
                                         local_10b8.mUpperData[(ulong)uVar6 - 0x80] & ~bVar2;
                                  }
                                  else {
                                    local_10b8.mUpperData[(ulong)uVar6 - 0x80] =
                                         local_10b8.mUpperData[(ulong)uVar6 - 0x80] | bVar2;
                                  }
                                }
                              }
                            }
                            else if (cVar1 == 'r') {
                              pcVar16 = strchr(pcVar8 + 1,0x40);
                              if (pcVar16 == (char *)0x0) {
                                uVar6 = local_10b8.mSFR[0x50] >> 3 & 3;
                              }
                              else {
                                *pcVar16 = '\0';
                                uVar6 = parse_dec(pcVar16 + 1);
                              }
                              uVar4 = parse_dec(pcVar8 + 1);
                              lVar11 = (long)(int)(uVar6 * 8) + (long)(int)uVar4;
                              for (; *pcVar9 != '\0'; pcVar9 = pcVar9 + 2) {
                                command_line._0_2_ = *(undefined2 *)pcVar9;
                                command_line[2] = '\0';
                                uVar5 = parse_hex(command_line);
                                printf("R%d@%d=%02X\n",(ulong)uVar4,(ulong)uVar6,(ulong)uVar5);
                                local_10b8.mLowerData[lVar11] = (uchar)uVar5;
                                lVar11 = lVar11 + 1;
                                uVar4 = uVar4 + 1;
                              }
                            }
                            else if (((cVar1 == 'p') && (pcVar8[1] == 'c')) && (pcVar8[2] == '\0'))
                            {
                              uVar6 = parse_hex(pcVar9);
                              printf("PC=%04X\n",(ulong)uVar6);
                              local_10b8.mPC = uVar6;
                            }
                            else {
                              printf("Unknown register \'%s\'\n",pcVar8);
                            }
                          }
                        }
                        else {
                          bVar17 = false;
                          printf("Unknown command \'%s\'\n",pcVar8);
                        }
                        goto LAB_00103082;
                      }
                      pcVar8 = strtok((char *)0x0," ");
                      lVar13 = (long)scsi_count;
                      iVar3 = scsi_count + 1;
                      for (lVar11 = 0; pcVar8[lVar11 * 2] != '\0'; lVar11 = lVar11 + 1) {
                        command_line._0_2_ = *(undefined2 *)(pcVar8 + lVar11 * 2);
                        command_line[2] = '\0';
                        uVar6 = parse_hex(command_line);
                        scsi_buffer[lVar13 + lVar11] = (uint8_t)uVar6;
                        scsi_count = iVar3 + (int)lVar11;
                      }
                    }
                    goto LAB_0010307f;
                  }
                  pcVar8 = strtok((char *)0x0," ");
                  printf("Loading from \'%s\'\n",pcVar8);
                  load = true;
                }
                bVar17 = false;
                transfer_state(load,pcVar8,&local_10b8);
              }
            }
            goto LAB_00103082;
          }
          requested_pause = true;
        }
LAB_0010307f:
        bVar17 = false;
      }
LAB_00103082:
      command_count = command_count - 1;
      free(*commands);
      memmove(commands,commands + 1,(ulong)command_count << 3);
      commands = (char **)realloc(commands,(ulong)command_count << 3);
    } while (!bVar17);
    requested_pause = false;
LAB_001035f8:
    lVar11 = 1;
    while (requested_pause == false) {
      if ((steps != 0xffffffff) && (steps = steps - 1, steps == 0)) {
        requested_pause = true;
      }
      tick(&local_10b8);
      bVar12 = trace;
      bVar2 = local_10b8.mSFR[0x10];
      if ((bVar2 & 1) == 0) {
        if (local_10b8.mPC == 0x23bb) {
          puts("Trying to find ATAPI handler");
        }
        else if (local_10b8.mPC == 0x27e2) {
          uVar15 = (ulong)(local_10b8.mSFR[0x50] & 0x18);
          printf("Setting sense: SK=%02X ASQ=%02X ASQC=%02X\n",
                 (ulong)local_10b8.mLowerData[uVar15 + 7],(ulong)local_10b8.mLowerData[uVar15 + 5],
                 (ulong)local_10b8.mLowerData[uVar15 + 3]);
        }
        bVar12 = bVar12 & 1;
      }
      else {
        bVar12 = local_10b8.mPC - 0x23caU < 0xffffffca & trace;
      }
      if (bVar12 != 0) {
        printf("bank %d: 0x%04X",(ulong)(bVar2 & 1),(ulong)(uint)local_10b8.mPC);
        printf(" R6: 0x%02X",(ulong)local_10b8.mLowerData[(ulong)(local_10b8.mSFR[0x50] & 0x18) + 6]
              );
        printf(" R4R5: 0x%02X%02X",
               (ulong)local_10b8.mLowerData[(ulong)(local_10b8.mSFR[0x50] & 0x18) + 4],
               (ulong)local_10b8.mLowerData[(ulong)(local_10b8.mSFR[0x50] & 0x18) + 5]);
        printf(" interrupt-active:%d",(ulong)(uint)local_10b8.mInterruptActive);
        printf(" IE.EA:%d",(ulong)(local_10b8.mSFR[0x28] & 0xffffff80));
        printf(" IE.EX1:%d",(ulong)(local_10b8.mSFR[0x28] & 4));
        printf(" TCON.IE1:%d",(ulong)(local_10b8.mSFR[8] & 8));
        printf(" IP.PX1:%d",(ulong)(local_10b8.mSFR[0x38] & 4));
        printf(" P1.5:%d",(ulong)(local_10b8.mSFR[0x10] >> 5 & 1));
        printf(" P1.6:%d",(ulong)(local_10b8.mSFR[0x10] >> 6 & 1));
        printf(" flash-state:%d/%d",(ulong)flash_state,(ulong)flash_chip_id);
        printf(" SCSI:");
        for (lVar13 = 0; lVar13 < scsi_count; lVar13 = lVar13 + 1) {
          printf("%02X",(ulong)scsi_buffer[lVar13]);
        }
        printf(" %llu",lVar11);
        putchar(10);
      }
      lVar11 = lVar11 + 1;
    }
  } while( true );
}

Assistant:

int main(int argc, char* argv[]) {

  // Load the firmware
  //FIXME: Turn into a command
  assert(argc > 1);
  FILE* f = fopen(argv[1], "rb");
  size_t ret = fread(flash, 1, sizeof(flash), f);
  assert(ret == sizeof(flash));
  fclose(f);

  // Create the virtual CPU
  struct em8051 _emu;
  memset(&_emu, 0, sizeof(_emu));

  // Set up virtual CPU
  struct em8051* emu = &_emu;
  emu->mCodeMem     = malloc(0x10000);
  emu->mCodeMemSize = 0x10000;
  emu->mExtData     = malloc(0x10000);
  emu->mExtDataSize = 0x10000;
  emu->mLowerData   = malloc(0x100);
  emu->mUpperData   = &emu->mLowerData[0x80];
  emu->mSFR         = malloc(0x80);
  emu->except       = emu_exception;
  emu->sfrread      = emu_sfrread;
  emu->sfrwrite = sfrwrite;
  emu->xread = xread;
  emu->xwrite = xwrite;

  // Reset virtual CPU
  reset(emu, 1);

  // Load bank 0 of firmware to memory
  load_bank(emu);

  // Process commands from command line
  for(int i = 2; i < argc; i++) {
    add_command(argv[i]);
  }

  // Enable pausing of emulator  
  install_pause_handler();


  // Start mainloop
  char* previous_command_line = strdup("");
  while(true) {

    // Check if we have to enter the shell
    if (requested_pause) {

      // Only handle pause if we no longer have anything queued
      if (command_count == 0) {

        printf("> ");
        char command_line[200];
        fgets(command_line, sizeof(command_line), stdin);

        char* newline = strchr(command_line, '\n');
        if (newline == command_line) {
          strcpy(command_line, previous_command_line);
        } else {
          *newline = '\0';

          free(previous_command_line);
          previous_command_line = strdup(command_line);
        }

        //FIXME: Split line by ;
        add_command(command_line);
      }

    }

    // Process all queued commands until we are supposed to run
    while(command_count > 0) {
      char* command_line = commands[0];
      printf("Command '%s'\n", command_line);
      bool run = handle_command(emu, command_line);
      delete_command();
      if (run) {
        requested_pause = false;
        break;
      }
    }

    // Run the CPU
    unsigned long long n = 1;
    while(!requested_pause) {

      // Use step counter
      if (steps != (unsigned int)-1) {
        steps--;
        if (steps == 0) {
          requested_pause = true;
        }
      }

      int ticked = tick(emu);
      unsigned int bank_index = emu->mSFR[REG_P1] & 1;

      bool info = trace;

      if (bank_index == 0) {
        switch(emu->mPC) {
        case 0x27e2:
          printf("Setting sense: SK=%02X ASQ=%02X ASQC=%02X\n", RX(7), RX(5), RX(3));
          //assert(false);
          break;
        case 0x23bb:
          printf("Trying to find ATAPI handler\n");
          break;
        }
      }

      if (bank_index == 1) {
        switch(emu->mPC) {

        case 0x2394 ... 0x23C9:
          // This is a rather tight loop that takes a while
          info = false;
          break;

        }
      }

      if(info) {
        printf("bank %d: 0x%04X", bank_index, emu->mPC);
        printf(" R6: 0x%02X", RX(6));
        printf(" R4R5: 0x%02X%02X", RX(4), RX(5));
        printf(" interrupt-active:%d", emu->mInterruptActive);
        printf(" IE.EA:%d", emu->mSFR[REG_IE] & IEMASK_EA);
        printf(" IE.EX1:%d", emu->mSFR[REG_IE] & IEMASK_EX1);
        printf(" TCON.IE1:%d", emu->mSFR[REG_TCON] & TCONMASK_IE1);
        printf(" IP.PX1:%d", emu->mSFR[REG_IP] & IPMASK_PX1);
        printf(" P1.5:%d", (emu->mSFR[REG_P1] >> 5) & 1);
        printf(" P1.6:%d", (emu->mSFR[REG_P1] >> 6) & 1);
        printf(" flash-state:%d/%d", flash_state, flash_chip_id);
        printf(" SCSI:");
        for(int i = 0; i < scsi_count; i++) {
          printf("%02X", scsi_buffer[i]);
        }
        printf(" %llu", n);
        printf("\n");
      }

      n++;

    }

  }

  return 0;
}